

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_bool32 ma_dr_flac__read_int32(ma_dr_flac_bs *bs,uint bitCount,ma_int32 *pResult)

{
  ulong uVar1;
  bool bVar2;
  ma_bool32 mVar3;
  int iVar4;
  uint uVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  uint *in_RDX;
  uint in_ESI;
  long in_RDI;
  ma_uint32 signbit;
  ma_uint32 result;
  ma_uint32 resultHi;
  ma_uint32 bitCountLo;
  ma_uint32 bitCountHi;
  undefined4 in_stack_ffffffffffffffb0;
  uint in_stack_ffffffffffffffb4;
  ma_bool32 local_30;
  
  bVar6 = (byte)in_ESI;
  if ((*(int *)(in_RDI + 0x2c) == 0x40) &&
     (mVar3 = ma_dr_flac__reload_cache
                        ((ma_dr_flac_bs *)
                         CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0)), mVar3 == 0)
     ) {
    bVar2 = false;
  }
  else if (0x40 - (ulong)*(uint *)(in_RDI + 0x2c) < (ulong)in_ESI) {
    iVar4 = 0x40 - *(int *)(in_RDI + 0x2c);
    uVar5 = in_ESI - iVar4;
    uVar1 = *(ulong *)(in_RDI + 0x1030);
    bVar7 = (byte)iVar4;
    mVar3 = ma_dr_flac__reload_cache
                      ((ma_dr_flac_bs *)
                       CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    if (mVar3 == 0) {
      bVar2 = false;
    }
    else if (0x40 - (ulong)*(uint *)(in_RDI + 0x2c) < (ulong)uVar5) {
      bVar2 = false;
    }
    else {
      bVar8 = (byte)uVar5;
      in_stack_ffffffffffffffb4 =
           (int)((uVar1 & (0xffffffffffffffffU >> (bVar7 & 0x3f) ^ 0xffffffffffffffff)) >>
                (0x40 - bVar7 & 0x3f)) << (bVar8 & 0x1f) |
           (uint)((*(ulong *)(in_RDI + 0x1030) &
                  (0xffffffffffffffffU >> (bVar8 & 0x3f) ^ 0xffffffffffffffff)) >>
                 (0x40 - bVar8 & 0x3f));
      *(uint *)(in_RDI + 0x2c) = uVar5 + *(int *)(in_RDI + 0x2c);
      *(long *)(in_RDI + 0x1030) = *(long *)(in_RDI + 0x1030) << (bVar8 & 0x3f);
      bVar2 = true;
    }
  }
  else {
    in_stack_ffffffffffffffb4 =
         (uint)((*(ulong *)(in_RDI + 0x1030) &
                (0xffffffffffffffffU >> (bVar6 & 0x3f) ^ 0xffffffffffffffff)) >>
               (0x40 - bVar6 & 0x3f));
    *(uint *)(in_RDI + 0x2c) = in_ESI + *(int *)(in_RDI + 0x2c);
    *(long *)(in_RDI + 0x1030) = *(long *)(in_RDI + 0x1030) << (bVar6 & 0x3f);
    bVar2 = true;
  }
  if (bVar2) {
    if (in_ESI < 0x20) {
      in_stack_ffffffffffffffb4 =
           (in_stack_ffffffffffffffb4 >> (bVar6 - 1 & 0x1f) & 1 ^ 0xffffffff) + 1 << (bVar6 & 0x1f)
           | in_stack_ffffffffffffffb4;
    }
    *in_RDX = in_stack_ffffffffffffffb4;
    local_30 = 1;
  }
  else {
    local_30 = 0;
  }
  return local_30;
}

Assistant:

static ma_bool32 ma_dr_flac__read_int32(ma_dr_flac_bs* bs, unsigned int bitCount, ma_int32* pResult)
{
    ma_uint32 result;
    MA_DR_FLAC_ASSERT(bs != NULL);
    MA_DR_FLAC_ASSERT(pResult != NULL);
    MA_DR_FLAC_ASSERT(bitCount > 0);
    MA_DR_FLAC_ASSERT(bitCount <= 32);
    if (!ma_dr_flac__read_uint32(bs, bitCount, &result)) {
        return MA_FALSE;
    }
    if (bitCount < 32) {
        ma_uint32 signbit;
        signbit = ((result >> (bitCount-1)) & 0x01);
        result |= (~signbit + 1) << bitCount;
    }
    *pResult = (ma_int32)result;
    return MA_TRUE;
}